

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void dlib::cpu::assign_conv_bias_gradient(tensor *grad,tensor *gradient_input)

{
  type_conflict3 tVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  ostream *poVar6;
  fatal_error *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar7;
  tensor *in_RSI;
  tensor *in_RDI;
  long c;
  long r;
  long k_1;
  long n;
  long k;
  float *gi;
  float *g;
  ostringstream dlib_o_out;
  string *in_stack_fffffffffffffd90;
  undefined8 in_stack_fffffffffffffd98;
  error_type t;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  float *local_1d0;
  ostream local_188;
  tensor *local_10;
  tensor *local_8;
  
  t = (error_type)((ulong)in_stack_fffffffffffffd98 >> 0x20);
  local_10 = in_RSI;
  local_8 = in_RDI;
  lVar3 = tensor::num_samples(in_RDI);
  if (lVar3 == 1) {
    lVar3 = tensor::k(local_8);
    if (0 < lVar3) {
      lVar3 = tensor::nr(local_8);
      if (lVar3 == 1) {
        lVar3 = tensor::nc(local_8);
        if (lVar3 == 1) {
          lVar3 = tensor::k(local_10);
          lVar4 = tensor::k(local_8);
          if (lVar3 == lVar4) {
            sVar5 = tensor::size(local_10);
            if (sVar5 != 0) {
              tVar1 = is_same_object<dlib::tensor,dlib::tensor>(local_8,local_10);
              if (!tVar1) {
                iVar2 = (*local_8->_vptr_tensor[3])();
                lVar3 = CONCAT44(extraout_var,iVar2);
                iVar2 = (*local_10->_vptr_tensor[2])();
                local_1d0 = (float *)CONCAT44(extraout_var_00,iVar2);
                local_1d8 = 0;
                while( true ) {
                  lVar4 = local_1d8;
                  lVar7 = tensor::k(local_10);
                  if (lVar7 <= lVar4) break;
                  *(undefined4 *)(lVar3 + local_1d8 * 4) = 0;
                  local_1d8 = local_1d8 + 1;
                }
                local_1e0 = 0;
                while( true ) {
                  lVar4 = local_1e0;
                  lVar7 = tensor::num_samples(local_10);
                  if (lVar7 <= lVar4) break;
                  local_1e8 = 0;
                  while( true ) {
                    lVar4 = tensor::k(local_10);
                    if (lVar4 <= local_1e8) break;
                    local_1f0 = 0;
                    while( true ) {
                      lVar4 = tensor::nr(local_10);
                      if (lVar4 <= local_1f0) break;
                      local_1f8 = 0;
                      while( true ) {
                        lVar4 = tensor::nc(local_10);
                        if (lVar4 <= local_1f8) break;
                        *(float *)(lVar3 + local_1e8 * 4) =
                             *local_1d0 + *(float *)(lVar3 + local_1e8 * 4);
                        local_1f8 = local_1f8 + 1;
                        local_1d0 = local_1d0 + 1;
                      }
                      local_1f0 = local_1f0 + 1;
                    }
                    local_1e8 = local_1e8 + 1;
                  }
                  local_1e0 = local_1e0 + 1;
                }
                return;
              }
            }
          }
        }
      }
    }
  }
  dlib_assert_breakpoint();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
  poVar6 = std::operator<<(&local_188,"\n\nError detected at line ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x17f);
  std::operator<<(poVar6,".\n");
  poVar6 = std::operator<<(&local_188,"Error detected in file ");
  poVar6 = std::operator<<(poVar6,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                          );
  std::operator<<(poVar6,".\n");
  poVar6 = std::operator<<(&local_188,"Error detected in function ");
  poVar6 = std::operator<<(poVar6,
                           "void dlib::cpu::assign_conv_bias_gradient(tensor &, const tensor &)");
  std::operator<<(poVar6,".\n\n");
  poVar6 = std::operator<<(&local_188,"Failing expression was ");
  poVar6 = std::operator<<(poVar6,
                           "grad.num_samples() == 1 && grad.k() >= 1 && grad.nr() == 1 && grad.nc() == 1 && gradient_input.k() == grad.k() && gradient_input.size() > 0 && is_same_object(grad,gradient_input) == false"
                          );
  std::operator<<(poVar6,".\n");
  poVar6 = (ostream *)std::ostream::operator<<(&local_188,std::boolalpha);
  poVar6 = std::operator<<(poVar6,"");
  std::operator<<(poVar6,"\n");
  this = (fatal_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::ostringstream::str();
  fatal_error::fatal_error(this,t,in_stack_fffffffffffffd90);
  __cxa_throw(this,&fatal_error::typeinfo,fatal_error::~fatal_error);
}

Assistant:

void assign_conv_bias_gradient (
            tensor& grad,
            const tensor& gradient_input
        )
        {
            DLIB_CASSERT(
                  grad.num_samples() == 1 &&
                  grad.k()  >= 1 &&
                  grad.nr() == 1 &&
                  grad.nc() == 1 &&
                  gradient_input.k() == grad.k() &&
                  gradient_input.size() > 0 && 
                  is_same_object(grad,gradient_input) == false
                  );

            auto g = grad.host();
            auto gi = gradient_input.host();

            for (long k = 0; k < gradient_input.k(); ++k)
                g[k] = 0;

            for (long n = 0; n < gradient_input.num_samples(); ++n)
            {
                for (long k = 0; k < gradient_input.k(); ++k)
                {
                    for (long r = 0; r < gradient_input.nr(); ++r)
                    {
                        for (long c = 0; c < gradient_input.nc(); ++c)
                        {
                            g[k] += (*gi++);
                        }
                    }
                }
            }
        }